

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O0

string * fs_expanduser_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  const_reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  allocator<char> local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_69;
  ulong local_68;
  size_type i;
  undefined1 local_58 [8];
  string home;
  allocator<char> local_21;
  undefined1 local_20 [8];
  string_view path_local;
  string *e;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  path_local._M_str = (char *)__return_storage_ptr__;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  if (bVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
    if (*pvVar4 == '~') {
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
      if (((sVar5 < 2) ||
          (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1),
          *pvVar4 == '/')) ||
         ((_Var3 = fs_is_windows(), _Var3 &&
          (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1),
          *pvVar4 == '\\')))) {
        fs_get_homedir_abi_cxx11_();
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
        ;
        if (bVar2) {
          std::__cxx11::string::string((string *)__return_storage_ptr__);
        }
        else {
          sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
          if (sVar5 < 3) {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_58);
          }
          else {
            local_68 = 2;
            while( true ) {
              uVar1 = local_68;
              sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
              bVar2 = false;
              if (uVar1 < sVar5) {
                pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_20,
                                    local_68);
                bVar2 = true;
                if (*pvVar4 != '/') {
                  _Var3 = fs_is_windows();
                  bVar2 = false;
                  if (_Var3) {
                    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20
                                        ,local_68);
                    bVar2 = *pvVar4 == '\\';
                  }
                }
              }
              if (!bVar2) break;
              local_68 = local_68 + 1;
            }
            local_69 = 0;
            std::operator+(&local_90,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58,"/");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      (local_d0,(basic_string_view<char,_std::char_traits<char>_> *)local_20,
                       &local_d1);
            std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_d0);
            std::operator+(__return_storage_ptr__,&local_90,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string(local_d0);
            std::allocator<char>::~allocator(&local_d1);
            std::__cxx11::string::~string((string *)&local_90);
            pcVar6 = (char *)std::__cxx11::string::back();
            if (*pcVar6 == '/') {
              std::__cxx11::string::pop_back();
            }
            local_69 = 1;
          }
        }
        i._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_58);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)__return_storage_ptr__,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_20,
                   (allocator<char> *)(home.field_2._M_local_buf + 0xb));
        std::allocator<char>::~allocator((allocator<char> *)(home.field_2._M_local_buf + 0xb));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_21);
      std::allocator<char>::~allocator(&local_21);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_expanduser(std::string_view path)
{
  if(path.empty()) FFS_UNLIKELY
    return {};

  if(path.front() != '~')
    return std::string(path);

  // second character is not a file separator
  // std::set is much slower than a simple if
  if(path.length() > 1 && !(path[1] == '/' || (fs_is_windows() && path[1] == '\\')))
    return std::string(path);

  std::string home = fs_get_homedir();
  if(home.empty()) FFS_UNLIKELY
    return {};

  if (path.length() < 3)
    return home;

// handle initial duplicated file separators. NOT .lexical_normal to handle "~/.."
// std::set is much slower than a simple if
  std::string::size_type i = 2;
  while(i < path.length() && (path[i] == '/' || (fs_is_windows() && path[i] == '\\')))
    i++;

  std::string e = home + "/" + std::string(path).substr(i);

  if (e.back() == '/')
    e.pop_back();

  return e;
}